

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O1

void qpdfjob_register_progress_reporter
               (qpdfjob_handle j,_func_void_int_void_ptr *report_progress,void *data)

{
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x10);
  *(_func_void_int_void_ptr **)local_48._M_unused._0_8_ = report_progress;
  *(void **)((long)local_48._M_unused._0_8_ + 8) = data;
  pcStack_30 = std::
               _Function_handler<void_(int),_std::_Bind<void_(*(std::_Placeholder<1>,_void_*))(int,_void_*)>_>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(int),_std::_Bind<void_(*(std::_Placeholder<1>,_void_*))(int,_void_*)>_>
             ::_M_manager;
  QPDFJob::registerProgressReporter(&j->j,(function<void_(int)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void
qpdfjob_register_progress_reporter(
    qpdfjob_handle j, void (*report_progress)(int percent, void* data), void* data)
{
    j->j.registerProgressReporter(std::bind(report_progress, std::placeholders::_1, data));
}